

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O0

bool __thiscall DelaunayMST::isInCircle(DelaunayMST *this,int a,int b,int c,int d)

{
  type pPVar1;
  size_t in_RDI;
  double dVar2;
  Point3d pd;
  Point3d pc;
  Point3d pb;
  Point3d pa;
  anon_class_1_0_00000001 mapToHiDim;
  unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *in_stack_ffffffffffffff40;
  Point3d local_b0;
  Point3d *in_stack_ffffffffffffff78;
  Point3d *in_stack_ffffffffffffff80;
  Point3d *in_stack_ffffffffffffff88;
  DelaunayMST *in_stack_ffffffffffffff90;
  Point3d local_68;
  Point3d local_50;
  Point3d local_38;
  anon_class_1_0_00000001 local_19 [25];
  
  pPVar1 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                     (in_stack_ffffffffffffff40,in_RDI);
  isInCircle::anon_class_1_0_00000001::operator()(&local_38,local_19,pPVar1);
  pPVar1 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                     (in_stack_ffffffffffffff40,in_RDI);
  isInCircle::anon_class_1_0_00000001::operator()(&local_50,local_19,pPVar1);
  pPVar1 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                     (in_stack_ffffffffffffff40,in_RDI);
  isInCircle::anon_class_1_0_00000001::operator()(&local_68,local_19,pPVar1);
  pPVar1 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                     (in_stack_ffffffffffffff40,in_RDI);
  isInCircle::anon_class_1_0_00000001::operator()
            ((Point3d *)&stack0xffffffffffffff80,local_19,pPVar1);
  pPVar1 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                     (in_stack_ffffffffffffff40,in_RDI);
  std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
            ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)pPVar1,in_RDI);
  std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
            ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)pPVar1,in_RDI);
  dVar2 = cross<Point2d>(in_stack_ffffffffffffff90,(Point2d *)in_stack_ffffffffffffff88,
                         (Point2d *)in_stack_ffffffffffffff80,(Point2d *)in_stack_ffffffffffffff78);
  if (dVar2 < 0.0) {
    std::swap<DelaunayMST::Point3d>(&local_50,&local_68);
  }
  cross<DelaunayMST::Point3d>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  Point3d::operator-(&local_b0,(Point3d *)&stack0xffffffffffffff80,&local_38);
  dVar2 = Point3d::dot((Point3d *)&stack0xffffffffffffff68,&local_b0);
  return dVar2 < 0.0;
}

Assistant:

bool isInCircle(int a, int b, int c, int d)
	{
		auto mapToHiDim = [](const Point2d &p2)
		{ return Point3d{p2.x, p2.y, p2.x * p2.x + p2.y * p2.y}; };
		Point3d pa = mapToHiDim(p[a]), pb = mapToHiDim(p[b]), pc = mapToHiDim(p[c]), pd = mapToHiDim(p[d]);
		if (cross(p[a], p[b], p[c]) < 0)
			std::swap(pb, pc);
		return Point3d::dot(cross(pa, pb, pc), (pd - pa)) < 0;
	}